

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O0

void llvm::DWARFYAML::EmitDebugAranges(raw_ostream *OS,Data *DI)

{
  bool bVar1;
  reference pAVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  reference pAVar6;
  uint64_t *puVar7;
  Hex64 HStack_b8;
  ARangeDescriptor Descriptor;
  iterator __end2;
  iterator __begin2;
  vector<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
  *__range2;
  uint64_t FirstDescriptor;
  uint64_t HeaderSize;
  uint64_t HeaderStart;
  ARange Range;
  const_iterator __end1;
  const_iterator __begin1;
  vector<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_> *__range1;
  Data *DI_local;
  raw_ostream *OS_local;
  
  __end1 = std::vector<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>::begin
                     (&DI->ARanges);
  Range.Descriptors.
  super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>::end
                          (&DI->ARanges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_llvm::DWARFYAML::ARange_*,_std::vector<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>_>
                                *)&Range.Descriptors.
                                   super__Vector_base<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    pAVar2 = __gnu_cxx::
             __normal_iterator<const_llvm::DWARFYAML::ARange_*,_std::vector<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>_>
             ::operator*(&__end1);
    ARange::ARange((ARange *)&HeaderStart,pAVar2);
    uVar3 = raw_ostream::tell(OS);
    writeInitialLength((InitialLength *)&HeaderStart,OS,(bool)(DI->IsLittleEndian & 1));
    writeInteger<unsigned_short>
              ((unsigned_short)Range.Length.TotalLength64,OS,(bool)(DI->IsLittleEndian & 1));
    writeInteger<unsigned_int>(Range.Length.TotalLength64._4_4_,OS,(bool)(DI->IsLittleEndian & 1));
    writeInteger<unsigned_char>((byte)Range.Version,OS,(bool)(DI->IsLittleEndian & 1));
    writeInteger<unsigned_char>(Range.Version._1_1_,OS,(bool)(DI->IsLittleEndian & 1));
    uVar4 = raw_ostream::tell(OS);
    uVar5 = alignTo(uVar4 - uVar3,(ulong)((uint)(byte)Range.Version * 2),0);
    ZeroFillBytes(OS,uVar5 - (uVar4 - uVar3));
    __end2 = std::
             vector<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
             ::begin((vector<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
                      *)&Range.AddrSize);
    Descriptor.Length =
         (uint64_t)
         std::
         vector<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
         ::end((vector<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
                *)&Range.AddrSize);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<llvm::DWARFYAML::ARangeDescriptor_*,_std::vector<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>_>
                                  *)&Descriptor.Length);
      if (!bVar1) break;
      pAVar6 = __gnu_cxx::
               __normal_iterator<llvm::DWARFYAML::ARangeDescriptor_*,_std::vector<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>_>
               ::operator*(&__end2);
      HStack_b8.value = (pAVar6->Address).value;
      Descriptor.Address.value = pAVar6->Length;
      puVar7 = yaml::Hex64::operator_cast_to_unsigned_long_(&HStack_b8);
      writeVariableSizedInteger
                (*puVar7,(ulong)(byte)Range.Version,OS,(bool)(DI->IsLittleEndian & 1));
      writeVariableSizedInteger
                (Descriptor.Address.value,(ulong)(byte)Range.Version,OS,
                 (bool)(DI->IsLittleEndian & 1));
      __gnu_cxx::
      __normal_iterator<llvm::DWARFYAML::ARangeDescriptor_*,_std::vector<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>_>
      ::operator++(&__end2);
    }
    ZeroFillBytes(OS,(ulong)((uint)(byte)Range.Version * 2));
    ARange::~ARange((ARange *)&HeaderStart);
    __gnu_cxx::
    __normal_iterator<const_llvm::DWARFYAML::ARange_*,_std::vector<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void DWARFYAML::EmitDebugAranges(raw_ostream &OS, const DWARFYAML::Data &DI) {
  for (auto Range : DI.ARanges) {
    auto HeaderStart = OS.tell();
    writeInitialLength(Range.Length, OS, DI.IsLittleEndian);
    writeInteger((uint16_t)Range.Version, OS, DI.IsLittleEndian);
    writeInteger((uint32_t)Range.CuOffset, OS, DI.IsLittleEndian);
    writeInteger((uint8_t)Range.AddrSize, OS, DI.IsLittleEndian);
    writeInteger((uint8_t)Range.SegSize, OS, DI.IsLittleEndian);

    auto HeaderSize = OS.tell() - HeaderStart;
    auto FirstDescriptor = alignTo(HeaderSize, Range.AddrSize * 2);
    ZeroFillBytes(OS, FirstDescriptor - HeaderSize);

    for (auto Descriptor : Range.Descriptors) {
      writeVariableSizedInteger(Descriptor.Address, Range.AddrSize, OS,
                                DI.IsLittleEndian);
      writeVariableSizedInteger(Descriptor.Length, Range.AddrSize, OS,
                                DI.IsLittleEndian);
    }
    ZeroFillBytes(OS, Range.AddrSize * 2);
  }
}